

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O2

void __thiscall psy::C::ParserTester::case0283(ParserTester *this)

{
  Expectation X;
  Expectation *pEVar1;
  LanguageExtensions *pLVar2;
  string *psVar3;
  initializer_list<psy::C::SyntaxKind> __l;
  undefined1 auVar4 [32];
  undefined1 in_stack_fffffffffffffde8 [112];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined2 uVar9;
  undefined1 in_stack_fffffffffffffe7a [38];
  ParseOptions in_stack_fffffffffffffea0;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffe18,"void x ( y , z ) int y ; int z ; { }",
             (allocator<char> *)&stack0xfffffffffffffdef);
  Expectation::Expectation((Expectation *)&stack0xfffffffffffffe88);
  uVar7 = 0x40103f6041203f0;
  uVar8 = 0x412040103f60412;
  uVar5 = 0x416040203f303e8;
  uVar6 = 0x41203f004190412;
  uVar9 = 0x469;
  __l._M_len = 0x11;
  __l._M_array = (iterator)&stack0xfffffffffffffe58;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
             &stack0xfffffffffffffdf0,__l,(allocator_type *)&stack0xfffffffffffffdee);
  pEVar1 = Expectation::AST((Expectation *)&stack0xfffffffffffffe88,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &stack0xfffffffffffffdf0);
  Expectation::Expectation(&local_c0,pEVar1);
  ParseOptions::ParseOptions((ParseOptions *)&stack0xfffffffffffffe38);
  LanguageExtensions::LanguageExtensions((LanguageExtensions *)&stack0xfffffffffffffe08);
  pLVar2 = LanguageExtensions::enable_extC_KandRStyle
                     ((LanguageExtensions *)&stack0xfffffffffffffe08,true);
  psVar3 = (string *)
           ParseOptions::withLanguageExtensions((ParseOptions *)&stack0xfffffffffffffe38,*pLVar2);
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)uVar5;
  auVar4 = in_stack_fffffffffffffde8._64_32_;
  X.numE_ = in_stack_fffffffffffffde8._0_4_;
  X.numW_ = in_stack_fffffffffffffde8._4_4_;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffde8._8_24_;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffde8._32_24_;
  X.continueTestDespiteOfErrors_ = (bool)in_stack_fffffffffffffde8[0x38];
  X.containsAmbiguity_ = (bool)in_stack_fffffffffffffde8[0x39];
  X._58_6_ = in_stack_fffffffffffffde8._58_6_;
  X.ambiguityText_._M_dataplus._M_p = (pointer)auVar4._0_8_;
  X.ambiguityText_._M_string_length = auVar4._8_8_;
  X.ambiguityText_.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar4._16_16_;
  X.unfinishedParse_ = (bool)in_stack_fffffffffffffde8[0x60];
  X._97_7_ = in_stack_fffffffffffffde8._97_7_;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffde8._104_8_;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)uVar6;
  X.declarations_.super__Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)uVar7;
  X.declarations_.super__Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)uVar8;
  X.declarations_.super__Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_2_ = uVar9;
  X._146_38_ = in_stack_fffffffffffffe7a;
  parse(this,*psVar3,X,(SyntaxCategory)&stack0xfffffffffffffe18,in_stack_fffffffffffffea0);
  Expectation::~Expectation(&local_c0);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            ((_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
             &stack0xfffffffffffffdf0);
  Expectation::~Expectation((Expectation *)&stack0xfffffffffffffe88);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
  return;
}

Assistant:

void ParserTester::case0283()
{
    parse("void x ( y , z ) int y ; int z ; { }",
          Expectation().AST({ SyntaxKind::TranslationUnit,
                              SyntaxKind::FunctionDefinition,
                              SyntaxKind::VoidTypeSpecifier,
                              SyntaxKind::FunctionDeclarator,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ParameterSuffix,
                              SyntaxKind::ParameterDeclaration,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ParameterDeclaration,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ExtKR_ParameterDeclaration,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ExtKR_ParameterDeclaration,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::CompoundStatement }),
          SyntaxTree::SyntaxCategory::Any,
          ParseOptions().withLanguageExtensions(
              LanguageExtensions().enable_extC_KandRStyle(true)));
}